

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::
vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
::reserve(vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
          *this,size_t n)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  memory_resource *pmVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  undefined4 extraout_var;
  long lVar9;
  ulong uVar10;
  PrimarySample *pPVar8;
  
  if (this->nAlloc < n) {
    if (n << 5 == 0) {
      pPVar8 = (PrimarySample *)0x0;
    }
    else {
      pmVar3 = (this->alloc).memoryResource;
      iVar7 = (*pmVar3->_vptr_memory_resource[2])(pmVar3,n << 5,8);
      pPVar8 = (PrimarySample *)CONCAT44(extraout_var,iVar7);
    }
    if (this->nStored != 0) {
      lVar9 = 0;
      uVar10 = 0;
      do {
        puVar1 = (undefined8 *)((long)&this->ptr->value + lVar9);
        uVar4 = puVar1[1];
        uVar5 = puVar1[2];
        uVar6 = puVar1[3];
        puVar2 = (undefined8 *)((long)&pPVar8->value + lVar9);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        puVar2[2] = uVar5;
        puVar2[3] = uVar6;
        uVar10 = uVar10 + 1;
        lVar9 = lVar9 + 0x20;
      } while (uVar10 < this->nStored);
    }
    if (this->ptr != (PrimarySample *)0x0) {
      pmVar3 = (this->alloc).memoryResource;
      (*pmVar3->_vptr_memory_resource[3])(pmVar3,this->ptr,this->nAlloc << 5,8);
    }
    this->nAlloc = n;
    this->ptr = pPVar8;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }